

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O0

float plutovg_font_face_traverse_glyph_path
                (plutovg_font_face_t *face,float size,float x,float y,plutovg_codepoint_t codepoint,
                plutovg_path_traverse_func_t traverse_func,void *closure)

{
  glyph_t *pgVar1;
  float sx;
  int local_7c;
  int i;
  glyph_t *glyph;
  plutovg_point_t current_point;
  plutovg_point_t points [3];
  plutovg_matrix_t matrix;
  float scale;
  void *closure_local;
  plutovg_path_traverse_func_t traverse_func_local;
  plutovg_codepoint_t codepoint_local;
  float y_local;
  float x_local;
  float size_local;
  plutovg_font_face_t *face_local;
  
  sx = plutovg_font_face_get_scale(face,size);
  plutovg_matrix_init_translate((plutovg_matrix_t *)&points[2].y,x,y);
  plutovg_matrix_scale((plutovg_matrix_t *)&points[2].y,sx,-sx);
  memset(&glyph,0,8);
  pgVar1 = plutovg_font_face_get_glyph(face,codepoint);
  for (local_7c = 0; local_7c < pgVar1->nvertices; local_7c = local_7c + 1) {
    switch(pgVar1->vertices[local_7c].type) {
    case '\x01':
      current_point.x = (float)(int)pgVar1->vertices[local_7c].x;
      current_point.y = (float)(int)pgVar1->vertices[local_7c].y;
      glyph = (glyph_t *)CONCAT44(current_point.y,current_point.x);
      plutovg_matrix_map_points((plutovg_matrix_t *)&points[2].y,&current_point,&current_point,1);
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_MOVE_TO,&current_point,1);
      break;
    case '\x02':
      current_point.x = (float)(int)pgVar1->vertices[local_7c].x;
      current_point.y = (float)(int)pgVar1->vertices[local_7c].y;
      glyph = (glyph_t *)CONCAT44(current_point.y,current_point.x);
      plutovg_matrix_map_points((plutovg_matrix_t *)&points[2].y,&current_point,&current_point,1);
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_LINE_TO,&current_point,1);
      break;
    case '\x03':
      current_point.x =
           (float)(int)pgVar1->vertices[local_7c].cx * 0.6666667 + glyph._0_4_ * 0.33333334;
      current_point.y =
           (float)(int)pgVar1->vertices[local_7c].cy * 0.6666667 + glyph._4_4_ * 0.33333334;
      points[0].x = (float)(int)pgVar1->vertices[local_7c].cx * 0.6666667 +
                    (float)(int)pgVar1->vertices[local_7c].x * 0.33333334;
      points[0].y = (float)(int)pgVar1->vertices[local_7c].cy * 0.6666667 +
                    (float)(int)pgVar1->vertices[local_7c].y * 0.33333334;
      points[1].x = (float)(int)pgVar1->vertices[local_7c].x;
      points[1].y = (float)(int)pgVar1->vertices[local_7c].y;
      glyph = (glyph_t *)CONCAT44(points[1].y,points[1].x);
      plutovg_matrix_map_points((plutovg_matrix_t *)&points[2].y,&current_point,&current_point,3);
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_CUBIC_TO,&current_point,3);
      break;
    case '\x04':
      current_point.x = (float)(int)pgVar1->vertices[local_7c].cx;
      current_point.y = (float)(int)pgVar1->vertices[local_7c].cy;
      points[0].x = (float)(int)pgVar1->vertices[local_7c].cx1;
      points[0].y = (float)(int)pgVar1->vertices[local_7c].cy1;
      points[1].x = (float)(int)pgVar1->vertices[local_7c].x;
      points[1].y = (float)(int)pgVar1->vertices[local_7c].y;
      glyph = (glyph_t *)CONCAT44(points[1].y,points[1].x);
      plutovg_matrix_map_points((plutovg_matrix_t *)&points[2].y,&current_point,&current_point,3);
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_CUBIC_TO,&current_point,3);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-font.c"
                    ,0x166,
                    "float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t *, float, float, float, plutovg_codepoint_t, plutovg_path_traverse_func_t, void *)"
                   );
    }
  }
  return (float)pgVar1->advance_width * sx;
}

Assistant:

float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t* face, float size, float x, float y, plutovg_codepoint_t codepoint, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float scale = plutovg_font_face_get_scale(face, size);
    plutovg_matrix_t matrix;
    plutovg_matrix_init_translate(&matrix, x, y);
    plutovg_matrix_scale(&matrix, scale, -scale);

    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    for(int i = 0; i < glyph->nvertices; i++) {
        switch(glyph->vertices[i].type) {
        case STBTT_vmove:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case STBTT_vline:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case STBTT_vcurve:
            points[0].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * current_point.x;
            points[0].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * current_point.y;
            points[1].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * glyph->vertices[i].x;
            points[1].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * glyph->vertices[i].y;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case STBTT_vcubic:
            points[0].x = glyph->vertices[i].cx;
            points[0].y = glyph->vertices[i].cy;
            points[1].x = glyph->vertices[i].cx1;
            points[1].y = glyph->vertices[i].cy1;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        default:
            assert(false);
        }
    }

    return glyph->advance_width * scale;
}